

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.hpp
# Opt level: O2

void duckdb::BitpackingPrimitives::PackBuffer<unsigned_short,false>
               (data_ptr_t dst,unsigned_short *src,idx_t count,bitpacking_width_t width)

{
  undefined3 in_register_00000009;
  ulong uVar1;
  unsigned_short *values;
  ulong uVar2;
  ulong uVar3;
  unsigned_short local_78 [36];
  
  uVar2 = count & 0xffffffffffffffe0;
  uVar3 = 0;
  values = src;
  for (uVar1 = 0; uVar1 < uVar2; uVar1 = uVar1 + 0x20) {
    PackGroup<unsigned_short>(dst + (uVar3 >> 3),values,width);
    uVar3 = uVar3 + (CONCAT31(in_register_00000009,width) << 5);
    values = values + 0x20;
  }
  if ((count & 0x1f) != 0) {
    uVar1 = (ulong)(uint)((int)(count & 0x1f) * 2);
    switchD_014c3389::default((void *)((long)local_78 + uVar1),0,0x40 - uVar1);
    switchD_01939fa4::default(local_78,src + uVar2,uVar1);
    PackGroup<unsigned_short>
              (dst + (CONCAT31(in_register_00000009,width) * uVar2 >> 3),local_78,width);
  }
  return;
}

Assistant:

inline static void PackBuffer(data_ptr_t dst, T *src, idx_t count, bitpacking_width_t width) {
		if (ASSUME_INPUT_ALIGNED) {
			for (idx_t i = 0; i < count; i += BITPACKING_ALGORITHM_GROUP_SIZE) {
				PackGroup<T>(dst + (i * width) / 8, src + i, width);
			}
		} else {
			idx_t misaligned_count = count % BITPACKING_ALGORITHM_GROUP_SIZE;
			count -= misaligned_count;
			for (idx_t i = 0; i < count; i += BITPACKING_ALGORITHM_GROUP_SIZE) {
				PackGroup<T>(dst + (i * width) / 8, src + i, width);
			}

			// The input is not aligned to BITPACKING_ALGORITHM_GROUP_SIZE.
			// Copy the unaligned count into a zero-initialized temporary group, and pack it.
			if (misaligned_count) {
				T tmp_buffer[BITPACKING_ALGORITHM_GROUP_SIZE] = {0};
				memcpy(tmp_buffer, src + count, misaligned_count * sizeof(T));
				PackGroup<T>(dst + (count * width) / 8, tmp_buffer, width);
			}
		}
	}